

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O2

int __thiscall cmCTestBuildHandler::ProcessHandler(cmCTestBuildHandler *this)

{
  string *this_00;
  string *this_01;
  size_type *this_02;
  cmCTest *pcVar1;
  pointer pbVar2;
  pointer pcVar3;
  size_type sVar4;
  bool bVar5;
  bool bVar6;
  ostream *poVar7;
  rep rVar8;
  char *extraout_RDX;
  long lVar9;
  int iVar10;
  char *pcVar11;
  string *s;
  pointer pbVar12;
  char *pcVar13;
  char **ppcVar14;
  pointer pcVar15;
  cmDuration cVar16;
  string_view value;
  int retVal;
  char *local_a30 [4];
  long local_a10;
  cmXMLWriter xml;
  string local_9b0;
  string local_990;
  string makeCommand;
  string local_950;
  cmStringReplaceHelper colorRemover;
  cmGeneratedFileStream xofs;
  ostringstream cmCTestLog_msg_14;
  cmGeneratedFileStream ofs;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&colorRemover);
  poVar7 = std::operator<<((ostream *)&colorRemover,"Build project");
  std::endl<char,std::char_traits<char>>(poVar7);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x12d,(char *)ofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                              _vptr_basic_ostream,(this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)&ofs);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&colorRemover);
  cVar16 = cmCTest::GetRemainingTimeAllowed((this->super_cmCTestGenericHandler).CTest);
  iVar10 = 0;
  if (120.0 <= cVar16.__r) {
    this_02 = &colorRemover.ErrorString._M_string_length;
    for (lVar9 = 0; lVar9 != 0x80; lVar9 = lVar9 + 0x10) {
      colorRemover.RegularExpression.regmatch.endp[0x1b] = (char *)0x0;
      colorRemover.RegularExpression.regmatch.endp[0x1d] = (char *)0x0;
      pcVar11 = *(char **)((long)&cmCTestWarningErrorFileLine[0].RegularExpressionString + lVar9);
      colorRemover.RegularExpression.regmatch.endp[0x1e]._0_4_ = 0;
      memset(this_02,0,0x20a);
      bVar5 = cmsys::RegularExpression::compile((RegularExpression *)this_02,pcVar11);
      if (bVar5) {
        colorRemover.ErrorString._M_dataplus._M_p =
             *(pointer *)((long)&cmCTestWarningErrorFileLine[0].FileIndex + lVar9);
        std::
        vector<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
        ::emplace_back<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>
                  (&this->ErrorWarningFileLineRegex,(cmCTestCompileErrorWarningRex *)&colorRemover);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ofs);
        poVar7 = std::operator<<((ostream *)&ofs,"Problem Compiling regular expression: ");
        poVar7 = std::operator<<(poVar7,pcVar11);
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x142,(char *)xofs.super_ofstream.
                                    super_basic_ostream<char,_std::char_traits<char>_>.
                                    _vptr_basic_ostream,false);
        std::__cxx11::string::~string((string *)&xofs);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ofs);
      }
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)this_02);
    }
    GetMakeCommand_abi_cxx11_(&makeCommand,this);
    if (makeCommand._M_string_length == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&colorRemover);
      poVar7 = std::operator<<((ostream *)&colorRemover,
                               "Cannot find MakeCommand key in the DartConfiguration.tcl");
      std::endl<char,std::char_traits<char>>(poVar7);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x14b,(char *)ofs.super_ofstream.
                                  super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream,false);
      std::__cxx11::string::~string((string *)&ofs);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&colorRemover);
      iVar10 = -1;
    }
    else {
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&colorRemover,"BuildDirectory",(allocator<char> *)&ofs);
      cmCTest::GetCTestConfiguration(&local_990,pcVar1,&colorRemover.ErrorString);
      std::__cxx11::string::~string((string *)&colorRemover);
      if (local_990._M_string_length == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&colorRemover);
        poVar7 = std::operator<<((ostream *)&colorRemover,
                                 "Cannot find BuildDirectory  key in the DartConfiguration.tcl");
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x154,(char *)ofs.super_ofstream.
                                    super_basic_ostream<char,_std::char_traits<char>_>.
                                    _vptr_basic_ostream,false);
        std::__cxx11::string::~string((string *)&ofs);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&colorRemover);
        iVar10 = -1;
      }
      else {
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&colorRemover,"UseLaunchers",(allocator<char> *)&ofs);
        cmCTest::GetCTestConfiguration(&local_9b0,pcVar1,&colorRemover.ErrorString);
        std::__cxx11::string::~string((string *)&colorRemover);
        value._M_str = extraout_RDX;
        value._M_len = (size_t)local_9b0._M_dataplus._M_p;
        bVar5 = cmValue::IsOn((cmValue *)local_9b0._M_string_length,value);
        this->UseCTestLaunch = bVar5;
        cmGeneratedFileStream::cmGeneratedFileStream(&ofs,None);
        local_a10 = std::chrono::_V2::steady_clock::now();
        bVar5 = cmCTestGenericHandler::StartLogFile(&this->super_cmCTestGenericHandler,"Build",&ofs)
        ;
        if (!bVar5) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&colorRemover);
          poVar7 = std::operator<<((ostream *)&colorRemover,"Cannot create build log file");
          std::endl<char,std::char_traits<char>>(poVar7);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x161,(char *)xofs.super_ofstream.
                                      super_basic_ostream<char,_std::char_traits<char>_>.
                                      _vptr_basic_ostream,false);
          std::__cxx11::string::~string((string *)&xofs);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&colorRemover);
        }
        for (ppcVar14 = cmCTestErrorMatches; *ppcVar14 != (char *)0x0; ppcVar14 = ppcVar14 + 1) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CustomErrorMatches,ppcVar14);
        }
        for (ppcVar14 = cmCTestErrorExceptions; *ppcVar14 != (char *)0x0; ppcVar14 = ppcVar14 + 1) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CustomErrorExceptions,ppcVar14);
        }
        for (ppcVar14 = cmCTestWarningMatches; *ppcVar14 != (char *)0x0; ppcVar14 = ppcVar14 + 1) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CustomWarningMatches,ppcVar14);
        }
        for (ppcVar14 = cmCTestWarningExceptions; *ppcVar14 != (char *)0x0; ppcVar14 = ppcVar14 + 1)
        {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CustomWarningExceptions,ppcVar14);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->ErrorMatchRegex);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&colorRemover);
        poVar7 = std::ostream::_M_insert<void_const*>(&colorRemover);
        poVar7 = std::operator<<(poVar7,"Add this->ErrorMatchRegex");
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x185,(char *)xofs.super_ofstream.
                                    super_basic_ostream<char,_std::char_traits<char>_>.
                                    _vptr_basic_ostream,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&xofs);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&colorRemover);
        pbVar2 = (this->CustomErrorMatches).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar12 = (this->CustomErrorMatches).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar2;
            pbVar12 = pbVar12 + 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&colorRemover);
          poVar7 = std::operator<<((ostream *)&colorRemover,"Add this->CustomErrorMatches: ");
          poVar7 = std::operator<<(poVar7,(string *)pbVar12);
          std::endl<char,std::char_traits<char>>(poVar7);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x185,(char *)xofs.super_ofstream.
                                      super_basic_ostream<char,_std::char_traits<char>_>.
                                      _vptr_basic_ostream,(this->super_cmCTestGenericHandler).Quiet)
          ;
          std::__cxx11::string::~string((string *)&xofs);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&colorRemover);
          std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                     &this->ErrorMatchRegex,pbVar12);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->ErrorExceptionRegex);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&colorRemover);
        poVar7 = std::ostream::_M_insert<void_const*>(&colorRemover);
        poVar7 = std::operator<<(poVar7,"Add this->ErrorExceptionRegex");
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x187,(char *)xofs.super_ofstream.
                                    super_basic_ostream<char,_std::char_traits<char>_>.
                                    _vptr_basic_ostream,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&xofs);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&colorRemover);
        pbVar2 = (this->CustomErrorExceptions).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar12 = (this->CustomErrorExceptions).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar2;
            pbVar12 = pbVar12 + 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&colorRemover);
          poVar7 = std::operator<<((ostream *)&colorRemover,"Add this->CustomErrorExceptions: ");
          poVar7 = std::operator<<(poVar7,(string *)pbVar12);
          std::endl<char,std::char_traits<char>>(poVar7);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x187,(char *)xofs.super_ofstream.
                                      super_basic_ostream<char,_std::char_traits<char>_>.
                                      _vptr_basic_ostream,(this->super_cmCTestGenericHandler).Quiet)
          ;
          std::__cxx11::string::~string((string *)&xofs);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&colorRemover);
          std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                     &this->ErrorExceptionRegex,pbVar12);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->WarningMatchRegex);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&colorRemover);
        poVar7 = std::ostream::_M_insert<void_const*>(&colorRemover);
        poVar7 = std::operator<<(poVar7,"Add this->WarningMatchRegex");
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x189,(char *)xofs.super_ofstream.
                                    super_basic_ostream<char,_std::char_traits<char>_>.
                                    _vptr_basic_ostream,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&xofs);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&colorRemover);
        pbVar2 = (this->CustomWarningMatches).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar12 = (this->CustomWarningMatches).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar2;
            pbVar12 = pbVar12 + 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&colorRemover);
          poVar7 = std::operator<<((ostream *)&colorRemover,"Add this->CustomWarningMatches: ");
          poVar7 = std::operator<<(poVar7,(string *)pbVar12);
          std::endl<char,std::char_traits<char>>(poVar7);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x189,(char *)xofs.super_ofstream.
                                      super_basic_ostream<char,_std::char_traits<char>_>.
                                      _vptr_basic_ostream,(this->super_cmCTestGenericHandler).Quiet)
          ;
          std::__cxx11::string::~string((string *)&xofs);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&colorRemover);
          std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                     &this->WarningMatchRegex,pbVar12);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->WarningExceptionRegex);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&colorRemover);
        poVar7 = std::ostream::_M_insert<void_const*>(&colorRemover);
        poVar7 = std::operator<<(poVar7,"Add this->WarningExceptionRegex");
        std::endl<char,std::char_traits<char>>(poVar7);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x18b,(char *)xofs.super_ofstream.
                                    super_basic_ostream<char,_std::char_traits<char>_>.
                                    _vptr_basic_ostream,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&xofs);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&colorRemover);
        pbVar2 = (this->CustomWarningExceptions).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar12 = (this->CustomWarningExceptions).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar2;
            pbVar12 = pbVar12 + 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&colorRemover);
          poVar7 = std::operator<<((ostream *)&colorRemover,"Add this->CustomWarningExceptions: ");
          poVar7 = std::operator<<(poVar7,(string *)pbVar12);
          std::endl<char,std::char_traits<char>>(poVar7);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x18b,(char *)xofs.super_ofstream.
                                      super_basic_ostream<char,_std::char_traits<char>_>.
                                      _vptr_basic_ostream,(this->super_cmCTestGenericHandler).Quiet)
          ;
          std::__cxx11::string::~string((string *)&xofs);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&colorRemover);
          std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                     &this->WarningExceptionRegex,pbVar12);
        }
        (this->SimplifySourceDir)._M_string_length = 0;
        *(this->SimplifySourceDir)._M_dataplus._M_p = '\0';
        (this->SimplifyBuildDir)._M_string_length = 0;
        *(this->SimplifyBuildDir)._M_dataplus._M_p = '\0';
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&xofs,"SourceDirectory",(allocator<char> *)&cmCTestLog_msg_14);
        cmCTest::GetCTestConfiguration(&colorRemover.ErrorString,pcVar1,(string *)&xofs);
        sVar4 = colorRemover.ErrorString._M_string_length;
        this_00 = &this->SimplifySourceDir;
        std::__cxx11::string::~string((string *)&colorRemover);
        std::__cxx11::string::~string((string *)&xofs);
        if (0x14 < sVar4) {
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cmCTestLog_msg_14,"SourceDirectory",(allocator<char> *)&xml);
          cmCTest::GetCTestConfiguration((string *)&xofs,pcVar1,(string *)&cmCTestLog_msg_14);
          std::operator+(&colorRemover.ErrorString,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xofs,
                         "/");
          std::__cxx11::string::~string((string *)&xofs);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
          lVar9 = std::__cxx11::string::rfind((char)&colorRemover,0x2f);
          if (lVar9 != -1) {
            std::__cxx11::string::resize((ulong)&colorRemover);
            std::__cxx11::string::operator=((string *)this_00,(string *)&colorRemover);
          }
          std::__cxx11::string::~string((string *)&colorRemover);
        }
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&xofs,"BuildDirectory",(allocator<char> *)&cmCTestLog_msg_14);
        cmCTest::GetCTestConfiguration(&colorRemover.ErrorString,pcVar1,(string *)&xofs);
        this_01 = &this->SimplifyBuildDir;
        std::__cxx11::string::~string((string *)&colorRemover);
        std::__cxx11::string::~string((string *)&xofs);
        if (0x14 < colorRemover.ErrorString._M_string_length) {
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cmCTestLog_msg_14,"BuildDirectory",(allocator<char> *)&xml);
          cmCTest::GetCTestConfiguration((string *)&xofs,pcVar1,(string *)&cmCTestLog_msg_14);
          std::operator+(&colorRemover.ErrorString,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xofs,
                         "/");
          std::__cxx11::string::~string((string *)&xofs);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
          lVar9 = std::__cxx11::string::rfind((char)&colorRemover,0x2f);
          if (lVar9 != -1) {
            std::__cxx11::string::resize((ulong)&colorRemover);
            std::__cxx11::string::operator=((string *)this_01,(string *)&colorRemover);
          }
          std::__cxx11::string::~string((string *)&colorRemover);
        }
        cmCTest::CurrentTime_abi_cxx11_
                  (&colorRemover.ErrorString,(this->super_cmCTestGenericHandler).CTest);
        std::__cxx11::string::operator=((string *)&this->StartBuild,(string *)&colorRemover);
        std::__cxx11::string::~string((string *)&colorRemover);
        rVar8 = std::chrono::_V2::system_clock::now();
        (this->StartBuildTime).__d.__r = rVar8;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&xofs,"\x1b\\[[0-9;]*m",(allocator<char> *)&cmCTestLog_msg_14);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_950,"",(allocator<char> *)&xml);
        cmStringReplaceHelper::cmStringReplaceHelper
                  (&colorRemover,(string *)&xofs,&local_950,(cmMakefile *)0x0);
        std::__cxx11::string::~string((string *)&local_950);
        std::__cxx11::string::~string((string *)&xofs);
        this->ColorRemover = &colorRemover;
        retVal = 0;
        bVar5 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
        if (bVar5) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&xofs);
          poVar7 = std::operator<<((ostream *)&xofs,"Build with command: ");
          poVar7 = std::operator<<(poVar7,(string *)&makeCommand);
          std::endl<char,std::char_traits<char>>(poVar7);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1b3,_cmCTestLog_msg_14,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xofs);
          bVar5 = false;
        }
        else {
          bVar5 = RunMakeCommand(this,&makeCommand,&retVal,local_990._M_dataplus._M_p,0,
                                 (ostream *)&ofs,Auto);
          bVar5 = !bVar5;
        }
        cmCTest::CurrentTime_abi_cxx11_((string *)&xofs,(this->super_cmCTestGenericHandler).CTest);
        std::__cxx11::string::operator=((string *)&this->EndBuild,(string *)&xofs);
        std::__cxx11::string::~string((string *)&xofs);
        rVar8 = std::chrono::_V2::system_clock::now();
        (this->EndBuildTime).__d.__r = rVar8;
        lVar9 = std::chrono::_V2::steady_clock::now();
        if ((this->SimplifySourceDir)._M_string_length != 0) {
          pcVar3 = (this->ErrorsAndWarnings).
                   super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pcVar15 = (this->ErrorsAndWarnings).
                         super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                         ._M_impl.super__Vector_impl_data._M_start; pcVar15 != pcVar3;
              pcVar15 = pcVar15 + 1) {
            cmsys::SystemTools::ReplaceString(&pcVar15->Text,(this_00->_M_dataplus)._M_p,"/.../");
            cmsys::SystemTools::ReplaceString
                      (&pcVar15->PreContext,(this_00->_M_dataplus)._M_p,"/.../");
            cmsys::SystemTools::ReplaceString
                      (&pcVar15->PostContext,(this_00->_M_dataplus)._M_p,"/.../");
          }
        }
        if ((this->SimplifyBuildDir)._M_string_length != 0) {
          pcVar3 = (this->ErrorsAndWarnings).
                   super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pcVar15 = (this->ErrorsAndWarnings).
                         super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                         ._M_impl.super__Vector_impl_data._M_start; pcVar15 != pcVar3;
              pcVar15 = pcVar15 + 1) {
            cmsys::SystemTools::ReplaceString(&pcVar15->Text,(this_01->_M_dataplus)._M_p,"/.../");
            cmsys::SystemTools::ReplaceString
                      (&pcVar15->PreContext,(this_01->_M_dataplus)._M_p,"/.../");
            cmsys::SystemTools::ReplaceString
                      (&pcVar15->PostContext,(this_01->_M_dataplus)._M_p,"/.../");
          }
        }
        cmGeneratedFileStream::cmGeneratedFileStream(&xofs,None);
        bVar6 = cmCTestGenericHandler::StartResultingXML
                          (&this->super_cmCTestGenericHandler,PartBuild,"Build",&xofs);
        if (bVar6) {
          cmXMLWriter::cmXMLWriter(&xml,(ostream *)&xofs,0);
          GenerateXMLHeader(this,&xml);
          if (this->UseCTestLaunch == true) {
            GenerateXMLLaunched(this,&xml);
          }
          else {
            GenerateXMLLogScraped(this,&xml);
          }
          GenerateXMLFooter(this,&xml,(cmDuration)((double)(lVar9 - local_a10) / 1000000000.0));
          if ((bVar5 || retVal != 0) || (0 < this->TotalErrors)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_14);
            poVar7 = std::operator<<((ostream *)&cmCTestLog_msg_14,"Error(s) when building project")
            ;
            std::endl<char,std::char_traits<char>>(poVar7);
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x1e5,local_a30[0],false);
            std::__cxx11::string::~string((string *)local_a30);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_14);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_14);
          poVar7 = std::operator<<((ostream *)&cmCTestLog_msg_14,"   ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->TotalErrors);
          pcVar13 = " or more";
          pcVar11 = " or more";
          if (this->TotalErrors < this->MaxErrors) {
            pcVar11 = "";
          }
          poVar7 = std::operator<<(poVar7,pcVar11);
          poVar7 = std::operator<<(poVar7," Compiler errors");
          std::endl<char,std::char_traits<char>>(poVar7);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1ec,local_a30[0],false);
          std::__cxx11::string::~string((string *)local_a30);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_14);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_14);
          poVar7 = std::operator<<((ostream *)&cmCTestLog_msg_14,"   ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->TotalWarnings);
          if (this->TotalWarnings < this->MaxWarnings) {
            pcVar13 = "";
          }
          poVar7 = std::operator<<(poVar7,pcVar13);
          poVar7 = std::operator<<(poVar7," Compiler warnings");
          std::endl<char,std::char_traits<char>>(poVar7);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1f1,local_a30[0],false);
          std::__cxx11::string::~string((string *)local_a30);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_14);
          iVar10 = retVal;
          cmXMLWriter::~cmXMLWriter(&xml);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_14);
          poVar7 = std::operator<<((ostream *)&cmCTestLog_msg_14,"Cannot create build XML file");
          std::endl<char,std::char_traits<char>>(poVar7);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1d7,(char *)xml.Output,false);
          std::__cxx11::string::~string((string *)&xml);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_14);
          iVar10 = -1;
        }
        cmGeneratedFileStream::~cmGeneratedFileStream(&xofs);
        cmStringReplaceHelper::~cmStringReplaceHelper(&colorRemover);
        cmGeneratedFileStream::~cmGeneratedFileStream(&ofs);
        std::__cxx11::string::~string((string *)&local_9b0);
      }
      std::__cxx11::string::~string((string *)&local_990);
    }
    std::__cxx11::string::~string((string *)&makeCommand);
  }
  return iVar10;
}

Assistant:

int cmCTestBuildHandler::ProcessHandler()
{
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "Build project" << std::endl,
                     this->Quiet);

  // do we have time for this
  if (this->CTest->GetRemainingTimeAllowed() < std::chrono::minutes(2)) {
    return 0;
  }

  int entry;
  for (entry = 0; cmCTestWarningErrorFileLine[entry].RegularExpressionString;
       ++entry) {
    cmCTestBuildHandler::cmCTestCompileErrorWarningRex r;
    if (r.RegularExpression.compile(
          cmCTestWarningErrorFileLine[entry].RegularExpressionString)) {
      r.FileIndex = cmCTestWarningErrorFileLine[entry].FileIndex;
      r.LineIndex = cmCTestWarningErrorFileLine[entry].LineIndex;
      this->ErrorWarningFileLineRegex.push_back(std::move(r));
    } else {
      cmCTestLog(
        this->CTest, ERROR_MESSAGE,
        "Problem Compiling regular expression: "
          << cmCTestWarningErrorFileLine[entry].RegularExpressionString
          << std::endl);
    }
  }

  // Determine build command and build directory
  std::string makeCommand = this->GetMakeCommand();
  if (makeCommand.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find MakeCommand key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  const std::string& buildDirectory =
    this->CTest->GetCTestConfiguration("BuildDirectory");
  if (buildDirectory.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find BuildDirectory  key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  std::string const& useLaunchers =
    this->CTest->GetCTestConfiguration("UseLaunchers");
  this->UseCTestLaunch = cmIsOn(useLaunchers);

  // Create a last build log
  cmGeneratedFileStream ofs;
  auto elapsed_time_start = std::chrono::steady_clock::now();
  if (!this->StartLogFile("Build", ofs)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create build log file" << std::endl);
  }

  // Create lists of regular expression strings for errors, error exceptions,
  // warnings and warning exceptions.
  std::vector<std::string>::size_type cc;
  for (cc = 0; cmCTestErrorMatches[cc]; cc++) {
    this->CustomErrorMatches.emplace_back(cmCTestErrorMatches[cc]);
  }
  for (cc = 0; cmCTestErrorExceptions[cc]; cc++) {
    this->CustomErrorExceptions.emplace_back(cmCTestErrorExceptions[cc]);
  }
  for (cc = 0; cmCTestWarningMatches[cc]; cc++) {
    this->CustomWarningMatches.emplace_back(cmCTestWarningMatches[cc]);
  }

  for (cc = 0; cmCTestWarningExceptions[cc]; cc++) {
    this->CustomWarningExceptions.emplace_back(cmCTestWarningExceptions[cc]);
  }

  // Pre-compile regular expressions objects for all regular expressions

#define cmCTestBuildHandlerPopulateRegexVector(strings, regexes)              \
  do {                                                                        \
    regexes.clear();                                                          \
    cmCTestOptionalLog(this->CTest, DEBUG,                                    \
                       this << "Add " #regexes << std::endl, this->Quiet);    \
    for (std::string const& s : (strings)) {                                  \
      cmCTestOptionalLog(this->CTest, DEBUG,                                  \
                         "Add " #strings ": " << s << std::endl,              \
                         this->Quiet);                                        \
      (regexes).emplace_back(s);                                              \
    }                                                                         \
  } while (false)

  cmCTestBuildHandlerPopulateRegexVector(this->CustomErrorMatches,
                                         this->ErrorMatchRegex);
  cmCTestBuildHandlerPopulateRegexVector(this->CustomErrorExceptions,
                                         this->ErrorExceptionRegex);
  cmCTestBuildHandlerPopulateRegexVector(this->CustomWarningMatches,
                                         this->WarningMatchRegex);
  cmCTestBuildHandlerPopulateRegexVector(this->CustomWarningExceptions,
                                         this->WarningExceptionRegex);

  // Determine source and binary tree substitutions to simplify the output.
  this->SimplifySourceDir.clear();
  this->SimplifyBuildDir.clear();
  if (this->CTest->GetCTestConfiguration("SourceDirectory").size() > 20) {
    std::string srcdir =
      this->CTest->GetCTestConfiguration("SourceDirectory") + "/";
    cc = srcdir.rfind('/', srcdir.size() - 2);
    if (cc != std::string::npos) {
      srcdir.resize(cc + 1);
      this->SimplifySourceDir = std::move(srcdir);
    }
  }
  if (this->CTest->GetCTestConfiguration("BuildDirectory").size() > 20) {
    std::string bindir =
      this->CTest->GetCTestConfiguration("BuildDirectory") + "/";
    cc = bindir.rfind('/', bindir.size() - 2);
    if (cc != std::string::npos) {
      bindir.resize(cc + 1);
      this->SimplifyBuildDir = std::move(bindir);
    }
  }

  // Ok, let's do the build

  // Remember start build time
  this->StartBuild = this->CTest->CurrentTime();
  this->StartBuildTime = std::chrono::system_clock::now();

  cmStringReplaceHelper colorRemover("\x1b\\[[0-9;]*m", "", nullptr);
  this->ColorRemover = &colorRemover;
  int retVal = 0;
  bool res = true;
  if (!this->CTest->GetShowOnly()) {
    res = this->RunMakeCommand(makeCommand, &retVal, buildDirectory.c_str(), 0,
                               ofs);
  } else {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "Build with command: " << makeCommand << std::endl,
                       this->Quiet);
  }

  // Remember end build time and calculate elapsed time
  this->EndBuild = this->CTest->CurrentTime();
  this->EndBuildTime = std::chrono::system_clock::now();
  auto elapsed_build_time =
    std::chrono::steady_clock::now() - elapsed_time_start;

  // Cleanups strings in the errors and warnings list.
  if (!this->SimplifySourceDir.empty()) {
    for (cmCTestBuildErrorWarning& evit : this->ErrorsAndWarnings) {
      cmSystemTools::ReplaceString(evit.Text, this->SimplifySourceDir.c_str(),
                                   "/.../");
      cmSystemTools::ReplaceString(evit.PreContext,
                                   this->SimplifySourceDir.c_str(), "/.../");
      cmSystemTools::ReplaceString(evit.PostContext,
                                   this->SimplifySourceDir.c_str(), "/.../");
    }
  }

  if (!this->SimplifyBuildDir.empty()) {
    for (cmCTestBuildErrorWarning& evit : this->ErrorsAndWarnings) {
      cmSystemTools::ReplaceString(evit.Text, this->SimplifyBuildDir.c_str(),
                                   "/.../");
      cmSystemTools::ReplaceString(evit.PreContext,
                                   this->SimplifyBuildDir.c_str(), "/.../");
      cmSystemTools::ReplaceString(evit.PostContext,
                                   this->SimplifyBuildDir.c_str(), "/.../");
    }
  }

  // Generate XML output
  cmGeneratedFileStream xofs;
  if (!this->StartResultingXML(cmCTest::PartBuild, "Build", xofs)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create build XML file" << std::endl);
    return -1;
  }
  cmXMLWriter xml(xofs);
  this->GenerateXMLHeader(xml);
  if (this->UseCTestLaunch) {
    this->GenerateXMLLaunched(xml);
  } else {
    this->GenerateXMLLogScraped(xml);
  }
  this->GenerateXMLFooter(xml, elapsed_build_time);

  if (!res || retVal || this->TotalErrors > 0) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error(s) when building project" << std::endl);
  }

  // Display message about number of errors and warnings
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   " << this->TotalErrors
                   << (this->TotalErrors >= this->MaxErrors ? " or more" : "")
                   << " Compiler errors" << std::endl);
  cmCTestLog(
    this->CTest, HANDLER_OUTPUT,
    "   " << this->TotalWarnings
          << (this->TotalWarnings >= this->MaxWarnings ? " or more" : "")
          << " Compiler warnings" << std::endl);

  return retVal;
}